

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-client.c
# Opt level: O3

int session_send(http2_session_data *session_data)

{
  int iVar1;
  undefined8 uVar2;
  
  iVar1 = nghttp2_session_send();
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    uVar2 = nghttp2_strerror(iVar1);
    warnx("Fatal error: %s",uVar2);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int session_send(http2_session_data *session_data) {
  int rv;

  rv = nghttp2_session_send(session_data->session);
  if (rv != 0) {
    warnx("Fatal error: %s", nghttp2_strerror(rv));
    return -1;
  }
  return 0;
}